

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<6ul,GF2::MOGrevlex<6ul>>::ModGB<GF2::MOGrevlex<6ul>>
          (MP<6UL,_GF2::MOGrevlex<6UL>_> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  undefined1 uVar1;
  bool bVar2;
  MM<6UL> *in_RDI;
  MP<6UL,_GF2::MOGrevlex<6UL>_> poly;
  MM<6UL> lm;
  bool changed;
  Geobucket<4UL> gb;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  Geobucket<4UL> *in_stack_ffffffffffffff60;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffff80;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffff88;
  Geobucket<4UL> *in_stack_ffffffffffffff90;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffff98;
  Geobucket<4UL> *in_stack_ffffffffffffffa0;
  byte local_41;
  
  MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::Geobucket
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  MP<6UL,_GF2::MOGrevlex<6UL>_>::SetEmpty((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c5448);
  local_41 = 0;
  MM<6UL>::MM((MM<6UL> *)0x1c5457);
  MP<6UL,_GF2::MOGrevlex<6UL>_>::MP
            ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_ffffffffffffff60,
             (MOGrevlex<6UL> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  while (uVar1 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::PopLM
                           (in_stack_ffffffffffffff90,(MM<6UL> *)in_stack_ffffffffffffff88),
        (bool)uVar1) {
    MP<6UL,_GF2::MOGrevlex<6UL>_>::LM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_ffffffffffffff60);
    bVar2 = MM<6UL>::IsDivisibleBy
                      ((MM<6UL> *)in_stack_ffffffffffffff68,(MM<6UL> *)in_stack_ffffffffffffff60);
    if (bVar2) {
      local_41 = 1;
      in_stack_ffffffffffffff68 =
           MP<6UL,_GF2::MOGrevlex<6UL>_>::operator=
                     ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_ffffffffffffff60,
                      (MP<6UL,_GF2::MOGrevlex<6UL>_> *)
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      MP<6UL,_GF2::MOGrevlex<6UL>_>::PopLM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c54dd);
      MP<6UL,_GF2::MOGrevlex<6UL>_>::LM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_ffffffffffffff60);
      MM<6UL>::operator/=((MM<6UL> *)CONCAT17(uVar1,in_stack_ffffffffffffff70),
                          (MM<6UL> *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff60 =
           (Geobucket<4UL> *)
           MP<6UL,_GF2::MOGrevlex<6UL>_>::operator*=(in_stack_ffffffffffffff80,in_RDI);
      MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::SymDiffSplice
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else {
      std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::push_back
                ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff70),(value_type *)in_stack_ffffffffffffff68);
    }
  }
  MP<6UL,_GF2::MOGrevlex<6UL>_>::~MP((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c5572);
  MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::~Geobucket(in_stack_ffffffffffffff60);
  return (bool)(local_41 & 1);
}

Assistant:

bool ModGB(const MP<_n, _O1>& polyRight)
	{	
		// поскольку операция выбора старшего монома задействована,
		// коэффициент роста geobucket выберем равным 4
		Geobucket<4> gb(*this);
		// будем сохранять в this остаток
		SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP poly(_order);
		while (gb.PopLM(lm))
			// делимость старших мономов?
			if (lm.IsDivisibleBy(polyRight.LM()))
			{
				changed = true;
				// готовим множитель
				(poly = polyRight).PopLM();
				// перемножаем и добавляем в geobucket
                gb.SymDiffSplice(poly *= (lm /= polyRight.LM()));
			}
			else
				// заносим lm в остаток
				push_back(lm);
		return changed;
	}